

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O3

REF_STATUS ref_phys_usm3d_bc_tag(REF_INT generic,REF_INT *usm3d)

{
  REF_INT RVar1;
  REF_INT RVar2;
  
  RVar1 = 1;
  if (generic != 0x1a06) {
    RVar1 = generic;
  }
  RVar2 = 2;
  if (generic != 0x13a2) {
    RVar2 = RVar1;
  }
  RVar1 = 3;
  if (generic != 5000) {
    RVar1 = RVar2;
  }
  RVar2 = 4;
  if (generic != 4000) {
    RVar2 = RVar1;
  }
  RVar1 = 5;
  if (generic != 3000) {
    RVar1 = RVar2;
  }
  RVar2 = 0x65;
  if (1 < generic - 0x13bbU) {
    RVar2 = RVar1;
  }
  RVar1 = 0x66;
  if (generic != 0x1b63) {
    RVar1 = RVar2;
  }
  RVar2 = 0x67;
  if (generic != 0x1b7c) {
    RVar2 = RVar1;
  }
  *usm3d = RVar2;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_phys_usm3d_bc_tag(REF_INT generic, REF_INT *usm3d) {
  *usm3d = generic;

  if (6662 == generic) *usm3d = 1; /* y symmetry */
  if (5026 == generic) *usm3d = 2; /* extrapolate */
  if (5000 == generic) *usm3d = 3; /* farfield riem */
  if (4000 == generic) *usm3d = 4; /* viscous solid */
  if (3000 == generic) *usm3d = 5; /* tangency */

  if (5051 == generic) *usm3d = 101; /* back pressure */
  if (5052 == generic) *usm3d = 101; /* mach outflow */
  if (7011 == generic) *usm3d = 102; /* total pressure */
  if (7036 == generic) *usm3d = 103; /* total pressure */

  return REF_SUCCESS;
}